

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_Vx_annotation.cpp
# Opt level: O0

ON_DimLinear *
ON_DimLinear::CreateFromV5DimLinear
          (ON_OBSOLETE_V5_DimLinear *V5_dim_linear,ON_3dmAnnotationContext *annotation_context,
          ON_DimLinear *destination)

{
  double distance_scale;
  V5_eAnnotationType VVar1;
  bool bVar2;
  ON_Plane *pOVar3;
  wchar_t *pwVar4;
  ON_OBSOLETE_V5_DimExtra *this;
  ON_DimStyle *pOVar5;
  ON_2dPoint OVar6;
  ON_2dPoint OVar7;
  ON_2dPoint OVar8;
  ON_2dPoint OVar9;
  ON_UUID OVar10;
  ON_DimLinear *local_228;
  ON_DimStyle *parent_dim_style;
  ON_OBSOLETE_V5_DimExtra *extra;
  ON_wString usrtext;
  ON_UUID dim_style_id;
  ON_3dVector horizontal;
  undefined1 local_198 [8];
  ON_3dPoint dimlinepoint;
  ON_3dPoint arrow2point;
  ON_3dPoint arrow1point;
  ON_3dPoint def2point;
  ON_3dPoint def1point;
  ON_wString dimtext;
  ON_Plane plane;
  ON_2dPoint defpt2;
  ON_2dPoint defpt1;
  ON_2dPoint arrow2;
  ON_2dPoint arrow1;
  ON_DimLinear *V6_dim_linear;
  V5_eAnnotationType dimtype;
  AnnotationType v6type;
  ON_DimLinear *destination_local;
  ON_3dmAnnotationContext *annotation_context_local;
  ON_OBSOLETE_V5_DimLinear *V5_dim_linear_local;
  
  VVar1 = ON_OBSOLETE_V5_Annotation::Type(&V5_dim_linear->super_ON_OBSOLETE_V5_Annotation);
  if (VVar1 == dtDimAligned) {
    V6_dim_linear._7_1_ = Aligned;
  }
  else {
    if (VVar1 != dtDimLinear) {
      return (ON_DimLinear *)(ON_OBSOLETE_V5_DimLinear *)0x0;
    }
    V6_dim_linear._7_1_ = Rotated;
  }
  destination_local = (ON_DimLinear *)annotation_context;
  if (annotation_context == (ON_3dmAnnotationContext *)0x0) {
    destination_local = (ON_DimLinear *)&ON_3dmAnnotationContext::Default;
  }
  local_228 = destination;
  if (destination == (ON_DimLinear *)0x0) {
    local_228 = (ON_DimLinear *)operator_new(0x390);
    ON_DimLinear(local_228);
  }
  OVar6 = ON_OBSOLETE_V5_Annotation::Point(&V5_dim_linear->super_ON_OBSOLETE_V5_Annotation,1);
  OVar7 = ON_OBSOLETE_V5_Annotation::Point(&V5_dim_linear->super_ON_OBSOLETE_V5_Annotation,3);
  OVar8 = ON_OBSOLETE_V5_Annotation::Point(&V5_dim_linear->super_ON_OBSOLETE_V5_Annotation,0);
  OVar9 = ON_OBSOLETE_V5_Annotation::Point(&V5_dim_linear->super_ON_OBSOLETE_V5_Annotation,2);
  pOVar3 = ON_OBSOLETE_V5_Annotation::Plane(&V5_dim_linear->super_ON_OBSOLETE_V5_Annotation);
  dimtext.m_s = (wchar_t *)(pOVar3->origin).x;
  pwVar4 = ON_OBSOLETE_V5_Annotation::TextValue(&V5_dim_linear->super_ON_OBSOLETE_V5_Annotation);
  ON_wString::ON_wString((ON_wString *)&def1point.z,pwVar4);
  ON_Plane::PointAt((ON_3dPoint *)&def2point.z,(ON_Plane *)&dimtext,OVar8.x,OVar8.y);
  ON_Plane::PointAt((ON_3dPoint *)&arrow1point.z,(ON_Plane *)&dimtext,OVar9.x,OVar9.y);
  ON_Plane::PointAt((ON_3dPoint *)&arrow2point.z,(ON_Plane *)&dimtext,OVar6.x,OVar6.y);
  ON_Plane::PointAt((ON_3dPoint *)&dimlinepoint.z,(ON_Plane *)&dimtext,OVar7.x,OVar7.y);
  ON_3dPoint::operator+
            ((ON_3dPoint *)&horizontal.z,(ON_3dPoint *)&arrow2point.z,(ON_3dPoint *)&dimlinepoint.z)
  ;
  ON_3dPoint::operator/((ON_3dPoint *)local_198,(ON_3dPoint *)&horizontal.z,2.0);
  horizontal.y = ON_3dVector::XAxis.z;
  dim_style_id.Data4 = (uchar  [8])ON_3dVector::XAxis.x;
  horizontal.x = ON_3dVector::XAxis.y;
  OVar10 = ON_3dmAnnotationContext::ParentDimStyleId((ON_3dmAnnotationContext *)destination_local);
  dim_style_id._0_8_ = OVar10.Data4;
  Create(local_228,V6_dim_linear._7_1_,OVar10,(ON_Plane *)&dimtext,(ON_3dVector *)dim_style_id.Data4
         ,(ON_3dPoint *)&def2point.z,(ON_3dPoint *)&arrow1point.z,(ON_3dPoint *)local_198,0.0);
  ON_Annotation::Internal_SetDimStyleFromV5Annotation
            ((ON_Annotation *)local_228,&V5_dim_linear->super_ON_OBSOLETE_V5_Annotation,
             (ON_3dmAnnotationContext *)destination_local);
  OVar6 = ON_OBSOLETE_V5_Annotation::Point(&V5_dim_linear->super_ON_OBSOLETE_V5_Annotation,4);
  usrtext.m_s = (wchar_t *)OVar6.x;
  ON_Dimension::Set2dTextPoint(&local_228->super_ON_Dimension,(ON_2dPoint *)&usrtext);
  bVar2 = ON_OBSOLETE_V5_Annotation::UserPositionedText
                    (&V5_dim_linear->super_ON_OBSOLETE_V5_Annotation);
  (*(local_228->super_ON_Dimension).super_ON_Annotation.super_ON_Geometry.super_ON_Object.
    _vptr_ON_Object[0x2c])(local_228,(ulong)((byte)~bVar2 & 1));
  pwVar4 = ON_OBSOLETE_V5_Annotation::TextFormula(&V5_dim_linear->super_ON_OBSOLETE_V5_Annotation);
  ON_wString::ON_wString((ON_wString *)&extra,pwVar4);
  ON_wString::Replace((ON_wString *)&extra,L"\\",L"\\\\");
  pwVar4 = ON_wString::Array((ON_wString *)&extra);
  ON_Dimension::SetUserText(&local_228->super_ON_Dimension,pwVar4);
  this = ON_OBSOLETE_V5_DimExtra::DimensionExtension(V5_dim_linear,false);
  if (this != (ON_OBSOLETE_V5_DimExtra *)0x0) {
    OVar10 = ON_OBSOLETE_V5_DimExtra::DetailMeasured(this);
    ON_Dimension::SetDetailMeasured(&local_228->super_ON_Dimension,OVar10);
    distance_scale = ON_OBSOLETE_V5_DimExtra::DistanceScale(this);
    ON_Dimension::SetDistanceScale(&local_228->super_ON_Dimension,distance_scale);
  }
  pOVar5 = ON_3dmAnnotationContext::ParentDimStyle((ON_3dmAnnotationContext *)destination_local);
  ON_DimStyle::ContentHash(pOVar5);
  pOVar5 = ON_Annotation::DimensionStyle((ON_Annotation *)local_228,pOVar5);
  ON_DimStyle::ContentHash(pOVar5);
  ON_wString::~ON_wString((ON_wString *)&extra);
  ON_wString::~ON_wString((ON_wString *)&def1point.z);
  ON_Plane::~ON_Plane((ON_Plane *)&dimtext);
  return local_228;
}

Assistant:

ON_DimLinear* ON_DimLinear::CreateFromV5DimLinear(
    const class ON_OBSOLETE_V5_DimLinear& V5_dim_linear,
    const class ON_3dmAnnotationContext* annotation_context,
    ON_DimLinear* destination
  )
{
  ON::AnnotationType v6type;
  ON_INTERNAL_OBSOLETE::V5_eAnnotationType dimtype = V5_dim_linear.Type();
  if (dimtype == ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAligned)
    v6type = ON::AnnotationType::Aligned;
  else  if (dimtype == ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear)
    v6type = ON::AnnotationType::Rotated;
  else
    return nullptr;

  if (nullptr == annotation_context)
    annotation_context = &ON_3dmAnnotationContext::Default;

  ON_DimLinear* V6_dim_linear
    = (nullptr != destination)
    ? destination
    : new ON_DimLinear();

  ON_2dPoint arrow1 = V5_dim_linear.Point(ON_OBSOLETE_V5_DimLinear::POINT_INDEX::arrow0_pt_index);
  ON_2dPoint arrow2 = V5_dim_linear.Point(ON_OBSOLETE_V5_DimLinear::POINT_INDEX::arrow1_pt_index);
  ON_2dPoint defpt1 = V5_dim_linear.Point(ON_OBSOLETE_V5_DimLinear::POINT_INDEX::ext0_pt_index);
  ON_2dPoint defpt2 = V5_dim_linear.Point(ON_OBSOLETE_V5_DimLinear::POINT_INDEX::ext1_pt_index);
  //ON_2dPoint textpt = V5_dim_linear.Point(ON_OBSOLETE_V5_DimLinear::POINT_INDEX::userpositionedtext_pt_index);
  ON_Plane plane = V5_dim_linear.Plane();
  ON_wString dimtext = V5_dim_linear.TextValue();

  ON_3dPoint def1point = plane.PointAt(defpt1.x, defpt1.y);
  ON_3dPoint def2point = plane.PointAt(defpt2.x, defpt2.y);
  ON_3dPoint arrow1point = plane.PointAt(arrow1.x, arrow1.y);
  ON_3dPoint arrow2point = plane.PointAt(arrow2.x, arrow2.y);
  ON_3dPoint dimlinepoint = (arrow1point + arrow2point) / 2.0;
  //ON_3dPoint textpoint = plane.PointAt(textpt.x, textpt.y);
  ON_3dVector horizontal = ON_3dVector::XAxis;

  const ON_UUID dim_style_id = annotation_context->ParentDimStyleId();
  V6_dim_linear->Create(v6type, dim_style_id, plane, horizontal, def1point, def2point, dimlinepoint, 0.0);
  V6_dim_linear->Internal_SetDimStyleFromV5Annotation(V5_dim_linear,annotation_context);
  V6_dim_linear->Set2dTextPoint(V5_dim_linear.Point(ON_OBSOLETE_V5_DimLinear::POINT_INDEX::userpositionedtext_pt_index));
  V6_dim_linear->SetUseDefaultTextPoint(!V5_dim_linear.UserPositionedText());
  ON_wString usrtext = V5_dim_linear.TextFormula();
  usrtext.Replace(L"\\", L"\\\\");
  V6_dim_linear->SetUserText(usrtext.Array());

  const ON_OBSOLETE_V5_DimExtra* extra = ON_OBSOLETE_V5_DimExtra::DimensionExtension(const_cast<ON_OBSOLETE_V5_DimLinear*>(&V5_dim_linear), false);
  if(nullptr != extra)
  {
    V6_dim_linear->SetDetailMeasured(extra->DetailMeasured());
    V6_dim_linear->SetDistanceScale(extra->DistanceScale());        
  }

  // updates any m_overrides to be current and updates content hash.
  const ON_DimStyle& parent_dim_style = annotation_context->ParentDimStyle();
  parent_dim_style.ContentHash();
  V6_dim_linear->DimensionStyle(parent_dim_style).ContentHash();

  return V6_dim_linear;
}